

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

_Bool mi_manage_os_memory_ex2
                (void *start,size_t size,_Bool is_large,int numa_node,_Bool exclusive,
                mi_memid_t memid,mi_arena_id_t *arena_id)

{
  ulong uVar1;
  undefined8 uVar2;
  uint8_t *puVar3;
  mi_arena_t *pmVar4;
  mi_bitmap_field_t *pmVar5;
  size_t sVar6;
  mi_bitmap_field_t *__s;
  ulong bitmap_fields;
  ulong uVar7;
  bool bVar8;
  mi_memid_t meta_memid;
  anon_union_16_2_8cef793c_for_mem local_48;
  undefined8 local_38;
  
  if (arena_id != (mi_arena_id_t *)0x0) {
    *arena_id = 0;
  }
  if (size < 0x2000000) {
    _mi_warning_message("the arena size is too small (memory at %p with size %zu)\n",start,size);
    return false;
  }
  puVar3 = (uint8_t *)start;
  sVar6 = size;
  if (((ulong)start & 0x1ffffff) != 0) {
    puVar3 = (uint8_t *)((long)start + 0x1ffffffU & 0xfffffffffe000000);
    sVar6 = size - ((long)puVar3 - (long)start);
    if (sVar6 < 0x2000000 || (size < (ulong)((long)puVar3 - (long)start) || sVar6 == 0)) {
      _mi_warning_message("after alignment, the size of the arena becomes too small (memory at %p with size %zu)\n"
                          ,start,size);
      return false;
    }
  }
  uVar7 = sVar6 >> 0x19;
  uVar1 = uVar7 + 0x3f;
  bitmap_fields = uVar1 >> 6;
  sVar6 = ((ulong)(memid.is_pinned ^ 1) * 2 + 3) * bitmap_fields * 8 + 0xc0;
  pmVar4 = (mi_arena_t *)_mi_arena_meta_zalloc(sVar6,(mi_memid_t *)&local_48.os);
  if (pmVar4 == (mi_arena_t *)0x0) {
    return false;
  }
  pmVar4->id = 0;
  (pmVar4->memid).mem.os.base = memid.mem.os.base;
  (pmVar4->memid).mem.os.size = memid.mem.os.size;
  uVar2 = memid._16_8_;
  (pmVar4->memid).is_pinned = (_Bool)(char)uVar2;
  (pmVar4->memid).initially_committed = (_Bool)(char)((ulong)uVar2 >> 8);
  (pmVar4->memid).initially_zero = (_Bool)(char)((ulong)uVar2 >> 0x10);
  (pmVar4->memid).field_0x13 = (char)((ulong)uVar2 >> 0x18);
  (pmVar4->memid).memkind = (int)((ulong)uVar2 >> 0x20);
  pmVar4->exclusive = exclusive;
  pmVar4->meta_size = sVar6;
  (pmVar4->meta_memid).mem.os.base = local_48.os.base;
  (pmVar4->meta_memid).mem.os.size = local_48.os.size;
  (pmVar4->meta_memid).is_pinned = (_Bool)(undefined1)local_38;
  (pmVar4->meta_memid).initially_committed = (_Bool)local_38._1_1_;
  (pmVar4->meta_memid).initially_zero = (_Bool)local_38._2_1_;
  (pmVar4->meta_memid).field_0x13 = local_38._3_1_;
  (pmVar4->meta_memid).memkind = local_38._4_4_;
  pmVar4->block_count = uVar7;
  pmVar4->field_count = bitmap_fields;
  LOCK();
  pmVar4->start = puVar3;
  UNLOCK();
  pmVar4->numa_node = numa_node;
  pmVar4->is_large = is_large;
  LOCK();
  pmVar4->purge_expire = 0;
  UNLOCK();
  LOCK();
  pmVar4->search_idx = 0;
  UNLOCK();
  pthread_mutex_init((pthread_mutex_t *)&pmVar4->abandoned_visit_lock,(pthread_mutexattr_t *)0x0);
  pmVar4->blocks_dirty = pmVar4->blocks_inuse + bitmap_fields;
  pmVar4->blocks_abandoned = pmVar4->blocks_inuse + bitmap_fields * 2;
  bVar8 = (pmVar4->memid).is_pinned != false;
  __s = pmVar4->blocks_inuse + bitmap_fields * 3;
  if (bVar8) {
    __s = (mi_bitmap_field_t *)0x0;
  }
  pmVar4->blocks_committed = __s;
  pmVar5 = pmVar4->blocks_inuse + bitmap_fields * 4;
  if (bVar8) {
    pmVar5 = (mi_bitmap_field_t *)0x0;
  }
  pmVar4->blocks_purge = pmVar5;
  if ((!bVar8) && ((pmVar4->memid).initially_committed == true)) {
    memset(__s,0xff,bitmap_fields * 8);
  }
  sVar6 = (uVar1 & 0xffffffffffffffc0) - uVar7;
  if (sVar6 != 0 && uVar7 <= (uVar1 & 0xffffffffffffffc0)) {
    _mi_bitmap_claim(pmVar4->blocks_inuse,bitmap_fields,sVar6,(uVar1 & 0xffffffffc0) - sVar6,
                     (_Bool *)0x0);
  }
  if (arena_id != (mi_arena_id_t *)0x0) {
    *arena_id = -1;
  }
  sVar6 = mi_arena_count;
  LOCK();
  UNLOCK();
  bVar8 = mi_arena_count < 0x84;
  if (bVar8) {
    mi_arena_count = mi_arena_count + 1;
    _mi_stat_counter_increase(&_mi_stats_main.arena_count,1);
    pmVar4->id = (int)sVar6 + 1;
    mi_arenas[sVar6] = pmVar4;
    if (arena_id == (mi_arena_id_t *)0x0) {
      return bVar8;
    }
    *arena_id = pmVar4->id;
    return bVar8;
  }
  LOCK();
  UNLOCK();
  return bVar8;
}

Assistant:

static bool mi_manage_os_memory_ex2(void* start, size_t size, bool is_large, int numa_node, bool exclusive, mi_memid_t memid, mi_arena_id_t* arena_id) mi_attr_noexcept
{
  if (arena_id != NULL) *arena_id = _mi_arena_id_none();
  if (size < MI_ARENA_BLOCK_SIZE) {
    _mi_warning_message("the arena size is too small (memory at %p with size %zu)\n", start, size);
    return false;
  }
  if (is_large) {
    mi_assert_internal(memid.initially_committed && memid.is_pinned);
  }
  if (!_mi_is_aligned(start, MI_SEGMENT_ALIGN)) {
    void* const aligned_start = mi_align_up_ptr(start, MI_SEGMENT_ALIGN);
    const size_t diff = (uint8_t*)aligned_start - (uint8_t*)start;
    if (diff >= size || (size - diff) < MI_ARENA_BLOCK_SIZE) {
      _mi_warning_message("after alignment, the size of the arena becomes too small (memory at %p with size %zu)\n", start, size);
      return false;
    }
    start = aligned_start;
    size = size - diff;
  }

  const size_t bcount = size / MI_ARENA_BLOCK_SIZE;
  const size_t fields = _mi_divide_up(bcount, MI_BITMAP_FIELD_BITS);
  const size_t bitmaps = (memid.is_pinned ? 3 : 5);
  const size_t asize  = sizeof(mi_arena_t) + (bitmaps*fields*sizeof(mi_bitmap_field_t));
  mi_memid_t meta_memid;
  mi_arena_t* arena   = (mi_arena_t*)_mi_arena_meta_zalloc(asize, &meta_memid);
  if (arena == NULL) return false;

  // already zero'd due to zalloc
  // _mi_memzero(arena, asize);
  arena->id = _mi_arena_id_none();
  arena->memid = memid;
  arena->exclusive = exclusive;
  arena->meta_size = asize;
  arena->meta_memid = meta_memid;
  arena->block_count = bcount;
  arena->field_count = fields;
  arena->start = (uint8_t*)start;
  arena->numa_node    = numa_node; // TODO: or get the current numa node if -1? (now it allows anyone to allocate on -1)
  arena->is_large     = is_large;
  arena->purge_expire = 0;
  arena->search_idx   = 0;
  mi_lock_init(&arena->abandoned_visit_lock);
  // consecutive bitmaps
  arena->blocks_dirty     = &arena->blocks_inuse[fields];     // just after inuse bitmap
  arena->blocks_abandoned = &arena->blocks_inuse[2 * fields]; // just after dirty bitmap
  arena->blocks_committed = (arena->memid.is_pinned ? NULL : &arena->blocks_inuse[3*fields]); // just after abandoned bitmap
  arena->blocks_purge     = (arena->memid.is_pinned ? NULL : &arena->blocks_inuse[4*fields]); // just after committed bitmap
  // initialize committed bitmap?
  if (arena->blocks_committed != NULL && arena->memid.initially_committed) {
    memset((void*)arena->blocks_committed, 0xFF, fields*sizeof(mi_bitmap_field_t)); // cast to void* to avoid atomic warning
  }

  // and claim leftover blocks if needed (so we never allocate there)
  ptrdiff_t post = (fields * MI_BITMAP_FIELD_BITS) - bcount;
  mi_assert_internal(post >= 0);
  if (post > 0) {
    // don't use leftover bits at the end
    mi_bitmap_index_t postidx = mi_bitmap_index_create(fields - 1, MI_BITMAP_FIELD_BITS - post);
    _mi_bitmap_claim(arena->blocks_inuse, fields, post, postidx, NULL);
  }
  return mi_arena_add(arena, arena_id, &_mi_stats_main);

}